

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O1

Gia_Man_t * Gia_ManMaxiUnfold(Gia_Man_t *p,int nFrames,int fUseVars,Vec_Int_t *vInit)

{
  int iVar1;
  char *__s;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  Gia_Obj_t *pGVar17;
  int iVar18;
  long lVar19;
  Gia_Obj_t *pGVar20;
  uint uVar21;
  
  p_00 = Gia_ManStart(p->nObjs * nFrames + p->nRegs * fUseVars * 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar13 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar11 = (iVar1 - iVar5) + iVar13;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_005af9c0;
      iVar5 = p->vCis->pArray[uVar11];
      if ((iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005af9a1;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar20 = p_00->pObjs;
      if ((pGVar7 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar7)) goto LAB_005af9df;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar20) >> 2) * -0x55555555);
      if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_005af9df;
      iVar13 = iVar13 + 1;
      iVar5 = p->nRegs;
    } while (iVar13 < iVar5);
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar13 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar11 = (iVar1 - iVar5) + iVar13;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_005af9c0;
      iVar1 = p->vCis->pArray[uVar11];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005af9a1;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar20 = p_00->pObjs;
      if ((pGVar7 < pGVar20) || (pGVar20 + p_00->nObjs <= pGVar7)) goto LAB_005af9df;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar20) >> 2) * -0x55555555);
      if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_005af9df;
      iVar13 = iVar13 + 1;
      iVar5 = p->nRegs;
    } while (iVar13 < iVar5);
  }
  if ((vInit != (Vec_Int_t *)0x0) && (vInit->nSize != iVar5)) {
    __assert_fail("!vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaxi.c"
                  ,0x54,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
  }
  uVar8 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar14 = 0;
    do {
      iVar5 = p->vCis->nSize;
      uVar12 = (ulong)(uint)(iVar5 - (int)uVar8) + lVar14;
      iVar13 = (int)uVar12;
      if ((iVar13 < 0) || (iVar5 <= iVar13)) goto LAB_005af9c0;
      iVar5 = p->vCis->pArray[uVar12 & 0xffffffff];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005af9a1;
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      if (vInit->nSize <= lVar14) goto LAB_005af9c0;
      iVar13 = p_00->vCis->nSize;
      if (iVar13 <= lVar14) goto LAB_005af9c0;
      piVar2 = p_00->vCis->pArray;
      iVar1 = piVar2[lVar14];
      if ((long)iVar1 < 0) goto LAB_005af9a1;
      iVar18 = p_00->nObjs;
      if (iVar18 <= iVar1) goto LAB_005af9a1;
      pGVar7 = p_00->pObjs;
      pGVar17 = (Gia_Obj_t *)((ulong)(pGVar7 + iVar1) & 0xfffffffffffffffe);
      if ((pGVar17 < pGVar7) || (pGVar7 + iVar18 <= pGVar17)) goto LAB_005af9df;
      iVar16 = (int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2);
      if (iVar16 * -0x55555555 < 0) {
LAB_005afa3c:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar8 = (uVar8 & 0xffffffff) + lVar14;
      iVar4 = (int)uVar8;
      if ((iVar4 < 0) || (iVar13 <= iVar4)) goto LAB_005af9c0;
      iVar13 = piVar2[uVar8 & 0xffffffff];
      if (((long)iVar13 < 0) || (iVar18 <= iVar13)) goto LAB_005af9a1;
      pGVar17 = (Gia_Obj_t *)((ulong)(pGVar7 + iVar13) & 0xfffffffffffffffe);
      if ((pGVar17 < pGVar7) || (pGVar7 + iVar18 <= pGVar17)) goto LAB_005af9df;
      iVar18 = (int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2);
      if (iVar18 * -0x55555555 < 0) goto LAB_005afa3c;
      if (5 < (uint)vInit->pArray[lVar14]) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaxi.c"
                      ,0x67,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
      }
      uVar11 = ((uint)(pGVar7 + iVar1) & 1) + iVar16 * 0x55555556;
      iVar13 = ((uint)(pGVar7 + iVar13) & 1) + iVar18 * 0x55555556;
      uVar21 = 0;
      switch(vInit->pArray[lVar14]) {
      case 0:
        uVar21 = 0;
        if (fUseVars != 0) goto switchD_005af3bb_caseD_2;
        break;
      case 1:
        if (fUseVars == 0) goto switchD_005af3bb_caseD_5;
      case 3:
        uVar21 = Gia_ManHashOr(p_00,uVar11 ^ 1,iVar13);
        break;
      case 2:
switchD_005af3bb_caseD_2:
        uVar21 = Gia_ManHashAnd(p_00,uVar11,iVar13);
        break;
      case 5:
switchD_005af3bb_caseD_5:
        uVar21 = 1;
      }
      pGVar20[iVar5].Value = uVar21;
      lVar14 = lVar14 + 1;
      uVar8 = (ulong)p->nRegs;
    } while (lVar14 < (long)uVar8);
  }
  if (0 < nFrames) {
    iVar5 = 0;
    do {
      pVVar9 = p->vCis;
      uVar8 = (ulong)(uint)pVVar9->nSize;
      if (p->nRegs < pVVar9->nSize) {
        lVar14 = 0;
        do {
          if ((int)uVar8 <= lVar14) goto LAB_005af9c0;
          iVar13 = pVVar9->pArray[lVar14];
          if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_005af9a1;
          pGVar20 = p->pObjs;
          if (pGVar20 == (Gia_Obj_t *)0x0) break;
          pGVar17 = Gia_ManAppendObj(p_00);
          uVar8 = *(ulong *)pGVar17;
          *(ulong *)pGVar17 = uVar8 | 0x9fffffff;
          *(ulong *)pGVar17 =
               uVar8 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p_00->pObjs;
          if ((pGVar17 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar17)) goto LAB_005af9df;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p_00->pObjs;
          if ((pGVar17 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar17)) goto LAB_005af9df;
          pGVar20[iVar13].Value = (int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2) * 0x55555556;
          lVar14 = lVar14 + 1;
          pVVar9 = p->vCis;
          uVar8 = (ulong)pVVar9->nSize;
        } while (lVar14 < (long)(uVar8 - (long)p->nRegs));
      }
      iVar13 = p->nObjs;
      if ((0 < iVar13) && (pGVar20 = p->pObjs, pGVar20 != (Gia_Obj_t *)0x0)) {
        lVar14 = 0;
        do {
          uVar8 = *(ulong *)pGVar20;
          if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
            if (((int)pGVar20[-(uVar8 & 0x1fffffff)].Value < 0) ||
               (uVar11 = (uint)(uVar8 >> 0x20),
               (int)pGVar20[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_005afa1d;
            uVar11 = Gia_ManHashAnd(p_00,pGVar20[-(uVar8 & 0x1fffffff)].Value ^
                                         (uint)(uVar8 >> 0x1d) & 1,
                                    pGVar20[-(ulong)(uVar11 & 0x1fffffff)].Value ^
                                    uVar11 >> 0x1d & 1);
            pGVar20->Value = uVar11;
          }
          lVar14 = lVar14 + 1;
          iVar13 = p->nObjs;
        } while ((lVar14 < iVar13) && (pGVar20 = p->pObjs + lVar14, p->pObjs != (Gia_Obj_t *)0x0));
      }
      iVar1 = p->nRegs;
      lVar14 = (long)iVar1;
      if (0 < lVar14) {
        pVVar9 = p->vCos;
        iVar18 = pVVar9->nSize;
        uVar8 = (ulong)(uint)(iVar18 - iVar1);
        lVar19 = lVar14;
        do {
          if (((int)uVar8 < 0) || (iVar18 <= (int)uVar8)) goto LAB_005af9c0;
          iVar16 = pVVar9->pArray[uVar8];
          if (((long)iVar16 < 0) || (iVar13 <= iVar16)) goto LAB_005af9a1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar20 = p->pObjs + iVar16;
          if ((int)pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value < 0) {
LAB_005afa1d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar20->Value =
               (uint)*(undefined8 *)pGVar20 >> 0x1d & 1 ^
               pGVar20[-(ulong)((uint)*(undefined8 *)pGVar20 & 0x1fffffff)].Value;
          uVar8 = uVar8 + 1;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      if (0 < iVar1) {
        pVVar9 = p->vCis;
        iVar18 = pVVar9->nSize;
        uVar8 = (ulong)(uint)(iVar18 - iVar1);
        do {
          if (((int)uVar8 < 0) || (iVar18 <= (int)uVar8)) goto LAB_005af9c0;
          iVar16 = pVVar9->pArray[uVar8];
          if (((long)iVar16 < 0) || (iVar13 <= iVar16)) goto LAB_005af9a1;
          pGVar20 = p->pObjs;
          if (pGVar20 == (Gia_Obj_t *)0x0) break;
          uVar3 = *(undefined8 *)(pGVar20 + iVar16);
          if ((((uint)uVar3 & 0x9fffffff) != 0x9fffffff) ||
             (uVar11 = (uint)((ulong)uVar3 >> 0x20) & 0x1fffffff, (int)uVar11 < iVar18 - iVar1)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = p->vCos->nSize;
          uVar11 = (iVar4 - iVar18) + uVar11;
          if (((int)uVar11 < 0) || (iVar4 <= (int)uVar11)) goto LAB_005af9c0;
          iVar4 = p->vCos->pArray[uVar11];
          if (((long)iVar4 < 0) || (iVar13 <= iVar4)) goto LAB_005af9a1;
          pGVar20[iVar16].Value = pGVar20[iVar4].Value;
          uVar8 = uVar8 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != nFrames);
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar13 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar11 = (iVar1 - iVar5) + iVar13;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_005af9c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar11];
      lVar14 = (long)iVar5;
      if ((lVar14 < 0) || (p->nObjs <= iVar5)) {
LAB_005af9a1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar20 = p->pObjs;
      if (pGVar20 == (Gia_Obj_t *)0x0) break;
      uVar11 = pGVar20[lVar14].Value;
      if ((int)uVar11 < 0) {
LAB_005afa5b:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar21 = uVar11 >> 1;
      if (p_00->nObjs <= (int)uVar21) goto LAB_005afa5b;
      if ((~*(uint *)(p_00->pObjs + uVar21) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar21) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar17 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar17;
      *(ulong *)pGVar17 = uVar8 | 0x80000000;
      pGVar7 = p_00->pObjs;
      if ((pGVar17 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar17)) {
LAB_005af9df:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar12 = (ulong)(((uint)((int)pGVar17 - (int)pGVar7) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                      );
      uVar15 = (ulong)((uVar11 & 1) << 0x1d);
      *(ulong *)pGVar17 = uVar15 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar12;
      *(ulong *)pGVar17 =
           uVar15 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar12 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar17 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar17)) goto LAB_005af9df;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar17 + -(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff),pGVar17)
        ;
      }
      pGVar7 = p_00->pObjs;
      if ((pGVar17 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar17)) goto LAB_005af9df;
      pGVar20[lVar14].Value = (int)((ulong)((long)pGVar17 - (long)pGVar7) >> 2) * 0x55555556;
      iVar13 = iVar13 + 1;
      iVar5 = p->nRegs;
    } while (iVar13 < iVar5);
  }
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (pGVar10->vCis->nSize - pGVar10->nRegs == (p->vCis->nSize - p->nRegs) * nFrames + p->nRegs * 2)
  {
    return pGVar10;
  }
  __assert_fail("Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaxi.c"
                ,0x78,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManMaxiUnfold( Gia_Man_t * p, int nFrames, int fUseVars, Vec_Int_t * vInit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, f;
    pNew = Gia_ManStart( fUseVars * 2 * Gia_ManRegNum(p) + nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // control/data variables
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    // build timeframes
    assert( !vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        int Value = Vec_IntEntry( vInit, i );
        int iCtrl = Gia_ManCiLit( pNew, i );
        int iData = Gia_ManCiLit( pNew, Gia_ManRegNum(p)+i );
        // decide based on Value
        if ( Value == 0 )
            pObj->Value = fUseVars ? Gia_ManHashAnd(pNew, iCtrl, iData) : 0;
        else if ( Value == 1 )
            pObj->Value = fUseVars ? Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData) : 1;
        else if ( Value == 2 )
            pObj->Value = Gia_ManHashAnd(pNew, iCtrl, iData);
        else if ( Value == 3 )
            pObj->Value = Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData);
        else if ( Value == 4 )
            pObj->Value = 0;
        else if ( Value == 5 )
            pObj->Value = 1;
        else assert( 0 );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRo( p, pObj, i )
            pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p) );
    return pNew;
}